

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

void metaf::Parser::addGroupToResult(long result,ReportPart param_2,string *param_3)

{
  long lVar1;
  char in_stack_00000200;
  char *local_270;
  size_type local_268;
  char local_260 [8];
  undefined8 uStack_258;
  GroupInfo groupInfo;
  
  lVar1 = *(long *)(result + 0x88);
  if (((*(long *)(result + 0x80) != lVar1) && (in_stack_00000200 == '\x15')) &&
     (*(char *)(lVar1 + -0x30) == '\x15')) {
    std::__cxx11::string::push_back((char)(string *)(lVar1 + -0x20));
    std::__cxx11::string::append((string *)(lVar1 + -0x20));
    return;
  }
  std::__cxx11::string::string((string *)&local_270,param_3);
  memcpy(&groupInfo,&stack0x00000008,0x200);
  groupInfo.rawString._M_dataplus._M_p = (pointer)&groupInfo.rawString.field_2;
  if (local_270 == local_260) {
    groupInfo.rawString.field_2._8_8_ = uStack_258;
  }
  else {
    groupInfo.rawString._M_dataplus._M_p = local_270;
  }
  groupInfo.rawString._M_string_length = local_268;
  local_268 = 0;
  local_260[0] = '\0';
  local_270 = local_260;
  groupInfo.reportPart = param_2;
  std::__cxx11::string::~string((string *)&local_270);
  std::vector<metaf::GroupInfo,_std::allocator<metaf::GroupInfo>_>::emplace_back<metaf::GroupInfo>
            ((vector<metaf::GroupInfo,_std::allocator<metaf::GroupInfo>_> *)(result + 0x80),
             &groupInfo);
  std::__cxx11::string::~string((string *)&groupInfo.rawString);
  return;
}

Assistant:

void Parser::addGroupToResult(ParseResult & result,
	Group group,
	ReportPart reportPart,
	std::string groupString)
{
	if (!result.groups.empty() && std::holds_alternative<FallbackGroup>(group)) {
		// Assumed that two fallback groups can always be appended 
		GroupInfo & lastGroupInfo = result.groups.back();
		if (std::get_if<FallbackGroup>(&lastGroupInfo.group)) {
			lastGroupInfo.rawString += groupDelimiterChar;
			lastGroupInfo.rawString += groupString;
			return;
		}
	}
	GroupInfo groupInfo(std::move(group), reportPart, groupString);
	result.groups.push_back(std::move(groupInfo));
}